

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_emr_describe_execute_plan.cc
# Opt level: O3

int __thiscall
aliyun::Emr::DescribeExecutePlan
          (Emr *this,EmrDescribeExecutePlanRequestType *req,
          EmrDescribeExecutePlanResponseType *response,EmrErrorInfo *error_info)

{
  iterator *piVar1;
  pointer pcVar2;
  iterator __position;
  AliRpcRequest *pAVar3;
  bool bVar4;
  int iVar5;
  Int IVar6;
  ArrayIndex AVar7;
  char *pcVar8;
  long *plVar9;
  size_t sVar10;
  Value *pVVar11;
  Value *pVVar12;
  Value *pVVar13;
  size_type *psVar14;
  uint uVar15;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  Value local_4c0;
  AliRpcRequest *local_4a8;
  string local_4a0;
  Value *local_480;
  undefined1 local_478 [32];
  _Alloc_hider local_458;
  size_type local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  _Alloc_hider local_438;
  size_type local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Alloc_hider local_418;
  size_type local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  _Alloc_hider local_3f8;
  size_type local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  Int local_3d8;
  Int local_3d4;
  _Alloc_hider local_3d0;
  size_type local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  _Alloc_hider local_3b0;
  size_type local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  _Alloc_hider local_390;
  size_type local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  uint local_36c;
  undefined1 local_368 [32];
  _Alloc_hider local_348;
  size_type local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  _Alloc_hider local_328;
  size_type local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  _Alloc_hider local_308;
  size_type local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  long *local_2e8;
  long local_2e0;
  long local_2d8 [2];
  string local_2c8;
  vector<aliyun::EmrDescribeExecutePlanEcsRoleType,_std::allocator<aliyun::EmrDescribeExecutePlanEcsRoleType>_>
  *local_2a8;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_local_buf[0] = '\0';
  pcVar8 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar8 = "https";
  }
  local_2e8 = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,pcVar8,pcVar8 + (ulong)this->use_tls_ + 4);
  local_4a8 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_478);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)local_368);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_4a0);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_2e8,local_2e0 + (long)local_2e8);
  std::__cxx11::string::append((char *)&local_140);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar14 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_2a0.field_2._M_allocated_capacity = *psVar14;
    local_2a0.field_2._8_8_ = plVar9[3];
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  }
  else {
    local_2a0.field_2._M_allocated_capacity = *psVar14;
    local_2a0._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2a0._M_string_length = plVar9[1];
  *plVar9 = (long)psVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  AliRpcRequest::AliRpcRequest(local_4a8,&local_160,&local_180,&local_1a0,&local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar8 = this->proxy_host_, pcVar8 != (char *)0x0)) &&
     (*pcVar8 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar10 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar8,pcVar8 + sVar10);
    AliHttpRequest::SetHttpProxy(&local_4a8->super_AliHttpRequest,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_4c0,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"DescribeExecutePlan","");
  AliHttpRequest::AddRequestQuery(&local_4a8->super_AliHttpRequest,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Id","");
    pcVar2 = (req->id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->id)._M_string_length);
    AliHttpRequest::AddRequestQuery(&local_4a8->super_AliHttpRequest,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_478);
    AliHttpRequest::AddRequestQuery(&local_4a8->super_AliHttpRequest,&local_280,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = (**(local_4a8->super_AliHttpRequest)._vptr_AliHttpRequest)();
  if (iVar5 == 0) {
    iVar5 = AliHttpRequest::WaitResponseHeaderComplete(&local_4a8->super_AliHttpRequest);
    AliHttpRequest::ReadResponseBody(&local_4a8->super_AliHttpRequest,&local_2c8);
    if (((0 < iVar5) && (local_2c8._M_string_length != 0)) &&
       (bVar4 = Json::Reader::parse(&local_140,&local_2c8,&local_4c0,true), bVar4)) {
      if (error_info != (EmrErrorInfo *)0x0 && iVar5 != 200) {
        bVar4 = Json::Value::isMember(&local_4c0,"RequestId");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4c0,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
        }
        else {
          local_478._0_8_ = local_478 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,anon_var_dwarf_1efbf4 + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_478);
        pcVar2 = local_478 + 0x10;
        if ((pointer)local_478._0_8_ != pcVar2) {
          operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
        }
        bVar4 = Json::Value::isMember(&local_4c0,"Code");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4c0,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
        }
        else {
          local_478._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,anon_var_dwarf_1efbf4 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_478);
        if ((pointer)local_478._0_8_ != pcVar2) {
          operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
        }
        bVar4 = Json::Value::isMember(&local_4c0,"HostId");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4c0,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
        }
        else {
          local_478._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,anon_var_dwarf_1efbf4 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_478);
        if ((pointer)local_478._0_8_ != pcVar2) {
          operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
        }
        bVar4 = Json::Value::isMember(&local_4c0,"Message");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4c0,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
        }
        else {
          local_478._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,anon_var_dwarf_1efbf4 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_478);
        if ((pointer)local_478._0_8_ != pcVar2) {
          operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
        }
      }
      if (response != (EmrDescribeExecutePlanResponseType *)0x0 && iVar5 == 200) {
        bVar4 = Json::Value::isMember(&local_4c0,"Id");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4c0,"Id");
          IVar6 = Json::Value::asInt(pVVar11);
          response->id = (long)IVar6;
        }
        bVar4 = Json::Value::isMember(&local_4c0,"Name");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4c0,"Name");
          Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
          std::__cxx11::string::operator=((string *)&response->name,(string *)local_478);
          if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
            operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
          }
        }
        bVar4 = Json::Value::isMember(&local_4c0,"Strategy");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4c0,"Strategy");
          IVar6 = Json::Value::asInt(pVVar11);
          response->strategy = IVar6;
        }
        bVar4 = Json::Value::isMember(&local_4c0,"TimeInterval");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4c0,"TimeInterval");
          IVar6 = Json::Value::asInt(pVVar11);
          response->time_interval = IVar6;
        }
        bVar4 = Json::Value::isMember(&local_4c0,"StartTime");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4c0,"StartTime");
          Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
          std::__cxx11::string::operator=((string *)&response->start_time,(string *)local_478);
          if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
            operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
          }
        }
        bVar4 = Json::Value::isMember(&local_4c0,"TimeUnit");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4c0,"TimeUnit");
          Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
          std::__cxx11::string::operator=((string *)&response->time_unit,(string *)local_478);
          if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
            operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
          }
        }
        bVar4 = Json::Value::isMember(&local_4c0,"IsCreateCluster");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4c0,"IsCreateCluster");
          bVar4 = Json::Value::asBool(pVVar11);
          response->is_create_cluster = bVar4;
        }
        bVar4 = Json::Value::isMember(&local_4c0,"JobInfos");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4c0,"JobInfos");
          bVar4 = Json::Value::isMember(pVVar11,"JobInfo");
          if (bVar4) {
            pVVar11 = Json::Value::operator[](&local_4c0,"JobInfos");
            pVVar11 = Json::Value::operator[](pVVar11,"JobInfo");
            bVar4 = Json::Value::isArray(pVVar11);
            if ((bVar4) && (AVar7 = Json::Value::size(pVVar11), AVar7 != 0)) {
              uVar15 = 0;
              do {
                pVVar12 = Json::Value::operator[](pVVar11,uVar15);
                bVar4 = Json::Value::isMember(pVVar12,"Id");
                if (bVar4) {
                  pVVar12 = Json::Value::operator[](pVVar12,"Id");
                  IVar6 = Json::Value::asInt(pVVar12);
                  local_478._0_8_ = SEXT48(IVar6);
                }
                __position._M_current = *(EmrDescribeExecutePlanJobInfoType **)&response->field_0x8;
                if (__position._M_current ==
                    *(EmrDescribeExecutePlanJobInfoType **)&response->field_0x10) {
                  std::
                  vector<aliyun::EmrDescribeExecutePlanJobInfoType,std::allocator<aliyun::EmrDescribeExecutePlanJobInfoType>>
                  ::_M_realloc_insert<aliyun::EmrDescribeExecutePlanJobInfoType_const&>
                            ((vector<aliyun::EmrDescribeExecutePlanJobInfoType,std::allocator<aliyun::EmrDescribeExecutePlanJobInfoType>>
                              *)response,__position,(EmrDescribeExecutePlanJobInfoType *)local_478);
                }
                else {
                  (__position._M_current)->id = local_478._0_8_;
                  *(EmrDescribeExecutePlanJobInfoType **)&response->field_0x8 =
                       __position._M_current + 1;
                }
                AVar7 = Json::Value::size(pVVar11);
                uVar15 = uVar15 + 1;
              } while (uVar15 < AVar7);
            }
          }
        }
        bVar4 = Json::Value::isMember(&local_4c0,"ClusterInfo");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4c0,"ClusterInfo");
          bVar4 = Json::Value::isMember(pVVar11,"ClusterId");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"ClusterId");
            IVar6 = Json::Value::asInt(pVVar12);
            (response->cluster_info).cluster_id = (long)IVar6;
          }
          bVar4 = Json::Value::isMember(pVVar11,"BizId");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"BizId");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).biz_id,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"ClusterName");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"ClusterName");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).cluster_name,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"UtcStartTime");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"UtcStartTime");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).utc_start_time,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"UtcStopTime");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"UtcStopTime");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).utc_stop_time,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"TimeOutEnable");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"TimeOutEnable");
            IVar6 = Json::Value::asInt(pVVar12);
            (response->cluster_info).time_out_enable = IVar6;
          }
          bVar4 = Json::Value::isMember(pVVar11,"TimeOutTime");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"TimeOutTime");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).time_out_time,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"TimeOutWarningWay");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"TimeOutWarningWay");
            IVar6 = Json::Value::asInt(pVVar12);
            (response->cluster_info).time_out_warning_way = IVar6;
          }
          bVar4 = Json::Value::isMember(pVVar11,"TimeOutOperate");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"TimeOutOperate");
            IVar6 = Json::Value::asInt(pVVar12);
            (response->cluster_info).time_out_operate = IVar6;
          }
          bVar4 = Json::Value::isMember(pVVar11,"ReleaseSetting");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"ReleaseSetting");
            IVar6 = Json::Value::asInt(pVVar12);
            (response->cluster_info).release_setting = IVar6;
          }
          bVar4 = Json::Value::isMember(pVVar11,"IsOpenOssLog");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"IsOpenOssLog");
            bVar4 = Json::Value::asBool(pVVar12);
            (response->cluster_info).is_open_oss_log = bVar4;
          }
          bVar4 = Json::Value::isMember(pVVar11,"Status");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"Status");
            IVar6 = Json::Value::asInt(pVVar12);
            (response->cluster_info).status = IVar6;
          }
          bVar4 = Json::Value::isMember(pVVar11,"LastJobStatus");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"LastJobStatus");
            IVar6 = Json::Value::asInt(pVVar12);
            (response->cluster_info).last_job_status = IVar6;
          }
          bVar4 = Json::Value::isMember(pVVar11,"RunningTime");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"RunningTime");
            IVar6 = Json::Value::asInt(pVVar12);
            (response->cluster_info).running_time = IVar6;
          }
          bVar4 = Json::Value::isMember(pVVar11,"FailReason");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"FailReason");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).fail_reason,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"OssPath");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"OssPath");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).oss_path,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"EmrRole4ECS");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"EmrRole4ECS");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).emr_role4_ec_s,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"EmrRole4Oss");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"EmrRole4Oss");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->cluster_info).emr_role4_oss,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"IsOpenPublicIp");
          if (bVar4) {
            pVVar11 = Json::Value::operator[](pVVar11,"IsOpenPublicIp");
            bVar4 = Json::Value::asBool(pVVar11);
            (response->cluster_info).is_open_public_ip = bVar4;
          }
        }
        bVar4 = Json::Value::isMember(&local_4c0,"SoftwareInfo");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4c0,"SoftwareInfo");
          bVar4 = Json::Value::isMember(pVVar11,"EmrVer");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"EmrVer");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=((string *)&response->software_info,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"ClusterType");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"ClusterType");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->software_info).cluster_type,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"Softwares");
          if (bVar4) {
            pVVar11 = Json::Value::operator[](pVVar11,"Softwares");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->software_info).softwares,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
        }
        bVar4 = Json::Value::isMember(&local_4c0,"EcsInfo");
        iVar5 = 200;
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4c0,"EcsInfo");
          bVar4 = Json::Value::isMember(pVVar11,"RegionId");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"RegionId");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).region_id,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"ZoneId");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"ZoneId");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).zone_id,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"ImageId");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"ImageId");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).image_id,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"ImageName");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"ImageName");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).image_name,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"SparkVersion");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"SparkVersion");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).spark_version,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"SecurityGroupId");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"SecurityGroupId");
            Json::Value::asString_abi_cxx11_((string *)local_478,pVVar12);
            std::__cxx11::string::operator=
                      ((string *)&(response->ecs_info).security_group_id,(string *)local_478);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
            }
          }
          bVar4 = Json::Value::isMember(pVVar11,"TotalCount");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"TotalCount");
            IVar6 = Json::Value::asInt(pVVar12);
            (response->ecs_info).total_count = IVar6;
          }
          bVar4 = Json::Value::isMember(pVVar11,"MasterCount");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"MasterCount");
            IVar6 = Json::Value::asInt(pVVar12);
            (response->ecs_info).master_count = IVar6;
          }
          bVar4 = Json::Value::isMember(pVVar11,"SlaveCount");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"SlaveCount");
            IVar6 = Json::Value::asInt(pVVar12);
            (response->ecs_info).slave_count = IVar6;
          }
          bVar4 = Json::Value::isMember(pVVar11,"EcsRoles");
          if (bVar4) {
            pVVar12 = Json::Value::operator[](pVVar11,"EcsRoles");
            bVar4 = Json::Value::isMember(pVVar12,"EcsRole");
            if (bVar4) {
              pVVar11 = Json::Value::operator[](pVVar11,"EcsRoles");
              local_480 = Json::Value::operator[](pVVar11,"EcsRole");
              bVar4 = Json::Value::isArray(local_480);
              if ((bVar4) && (AVar7 = Json::Value::size(local_480), AVar7 != 0)) {
                local_2a8 = &(response->ecs_info).ecs_roles;
                pcVar2 = local_368 + 0x10;
                uVar15 = 0;
                do {
                  local_478._0_8_ = (pointer)0x0;
                  local_478._8_8_ = (pointer)0x0;
                  local_478._16_8_ = 0;
                  local_458._M_p = (pointer)&local_448;
                  local_450 = 0;
                  local_448._M_local_buf[0] = '\0';
                  local_438._M_p = (pointer)&local_428;
                  local_430 = 0;
                  local_428._M_local_buf[0] = '\0';
                  local_418._M_p = (pointer)&local_408;
                  local_410 = 0;
                  local_408._M_local_buf[0] = '\0';
                  local_3f8._M_p = (pointer)&local_3e8;
                  local_3f0 = 0;
                  local_3e8._M_local_buf[0] = '\0';
                  local_3d0._M_p = (pointer)&local_3c0;
                  local_3c8 = 0;
                  local_3c0._M_local_buf[0] = '\0';
                  local_3b0._M_p = (pointer)&local_3a0;
                  local_3a8 = 0;
                  local_3a0._M_local_buf[0] = '\0';
                  local_390._M_p = (pointer)&local_380;
                  local_388 = 0;
                  local_380._M_local_buf[0] = '\0';
                  local_36c = uVar15;
                  pVVar11 = Json::Value::operator[](local_480,uVar15);
                  bVar4 = Json::Value::isMember(pVVar11,"IsMaster");
                  if (bVar4) {
                    pVVar12 = Json::Value::operator[](pVVar11,"IsMaster");
                    local_478[0x18] = Json::Value::asBool(pVVar12);
                  }
                  bVar4 = Json::Value::isMember(pVVar11,"InstanceType");
                  if (bVar4) {
                    pVVar12 = Json::Value::operator[](pVVar11,"InstanceType");
                    Json::Value::asString_abi_cxx11_((string *)local_368,pVVar12);
                    std::__cxx11::string::operator=((string *)&local_458,(string *)local_368);
                    if ((pointer)local_368._0_8_ != pcVar2) {
                      operator_delete((void *)local_368._0_8_,
                                      CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
                    }
                  }
                  bVar4 = Json::Value::isMember(pVVar11,"Payment");
                  if (bVar4) {
                    pVVar12 = Json::Value::operator[](pVVar11,"Payment");
                    Json::Value::asString_abi_cxx11_((string *)local_368,pVVar12);
                    std::__cxx11::string::operator=((string *)&local_438,(string *)local_368);
                    if ((pointer)local_368._0_8_ != pcVar2) {
                      operator_delete((void *)local_368._0_8_,
                                      CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
                    }
                  }
                  bVar4 = Json::Value::isMember(pVVar11,"CpuCore");
                  if (bVar4) {
                    pVVar12 = Json::Value::operator[](pVVar11,"CpuCore");
                    Json::Value::asString_abi_cxx11_((string *)local_368,pVVar12);
                    std::__cxx11::string::operator=((string *)&local_418,(string *)local_368);
                    if ((pointer)local_368._0_8_ != pcVar2) {
                      operator_delete((void *)local_368._0_8_,
                                      CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
                    }
                  }
                  bVar4 = Json::Value::isMember(pVVar11,"MemoryCapacity");
                  if (bVar4) {
                    pVVar12 = Json::Value::operator[](pVVar11,"MemoryCapacity");
                    Json::Value::asString_abi_cxx11_((string *)local_368,pVVar12);
                    std::__cxx11::string::operator=((string *)&local_3f8,(string *)local_368);
                    if ((pointer)local_368._0_8_ != pcVar2) {
                      operator_delete((void *)local_368._0_8_,
                                      CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
                    }
                  }
                  bVar4 = Json::Value::isMember(pVVar11,"DiskType");
                  if (bVar4) {
                    pVVar12 = Json::Value::operator[](pVVar11,"DiskType");
                    local_3d8 = Json::Value::asInt(pVVar12);
                  }
                  bVar4 = Json::Value::isMember(pVVar11,"DiskCapacity");
                  if (bVar4) {
                    pVVar12 = Json::Value::operator[](pVVar11,"DiskCapacity");
                    local_3d4 = Json::Value::asInt(pVVar12);
                  }
                  bVar4 = Json::Value::isMember(pVVar11,"BandWidth");
                  if (bVar4) {
                    pVVar12 = Json::Value::operator[](pVVar11,"BandWidth");
                    Json::Value::asString_abi_cxx11_((string *)local_368,pVVar12);
                    std::__cxx11::string::operator=((string *)&local_3d0,(string *)local_368);
                    if ((pointer)local_368._0_8_ != pcVar2) {
                      operator_delete((void *)local_368._0_8_,
                                      CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
                    }
                  }
                  bVar4 = Json::Value::isMember(pVVar11,"NetPayType");
                  if (bVar4) {
                    pVVar12 = Json::Value::operator[](pVVar11,"NetPayType");
                    Json::Value::asString_abi_cxx11_((string *)local_368,pVVar12);
                    std::__cxx11::string::operator=((string *)&local_3b0,(string *)local_368);
                    if ((pointer)local_368._0_8_ != pcVar2) {
                      operator_delete((void *)local_368._0_8_,
                                      CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
                    }
                  }
                  bVar4 = Json::Value::isMember(pVVar11,"EcsPayType");
                  if (bVar4) {
                    pVVar12 = Json::Value::operator[](pVVar11,"EcsPayType");
                    Json::Value::asString_abi_cxx11_((string *)local_368,pVVar12);
                    std::__cxx11::string::operator=((string *)&local_390,(string *)local_368);
                    if ((pointer)local_368._0_8_ != pcVar2) {
                      operator_delete((void *)local_368._0_8_,
                                      CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
                    }
                  }
                  bVar4 = Json::Value::isMember(pVVar11,"Nodes");
                  if (bVar4) {
                    pVVar12 = Json::Value::operator[](pVVar11,"Nodes");
                    bVar4 = Json::Value::isMember(pVVar12,"Node");
                    if (bVar4) {
                      pVVar11 = Json::Value::operator[](pVVar11,"Nodes");
                      pVVar11 = Json::Value::operator[](pVVar11,"Node");
                      bVar4 = Json::Value::isArray(pVVar11);
                      if ((bVar4) && (AVar7 = Json::Value::size(pVVar11), AVar7 != 0)) {
                        uVar15 = 0;
                        do {
                          local_368._8_8_ = 0;
                          local_368[0x10] = '\0';
                          local_348._M_p = (pointer)&local_338;
                          local_340 = 0;
                          local_338._M_local_buf[0] = '\0';
                          local_328._M_p = (pointer)&local_318;
                          local_320 = 0;
                          local_318._M_local_buf[0] = '\0';
                          local_308._M_p = (pointer)&local_2f8;
                          local_300 = 0;
                          local_2f8._M_local_buf[0] = '\0';
                          local_368._0_8_ = pcVar2;
                          pVVar12 = Json::Value::operator[](pVVar11,uVar15);
                          bVar4 = Json::Value::isMember(pVVar12,"InstanceId");
                          if (bVar4) {
                            pVVar13 = Json::Value::operator[](pVVar12,"InstanceId");
                            Json::Value::asString_abi_cxx11_(&local_4a0,pVVar13);
                            std::__cxx11::string::operator=
                                      ((string *)local_368,(string *)&local_4a0);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                              operator_delete(local_4a0._M_dataplus._M_p,
                                              local_4a0.field_2._M_allocated_capacity + 1);
                            }
                          }
                          bVar4 = Json::Value::isMember(pVVar12,"PubIp");
                          if (bVar4) {
                            pVVar13 = Json::Value::operator[](pVVar12,"PubIp");
                            Json::Value::asString_abi_cxx11_(&local_4a0,pVVar13);
                            std::__cxx11::string::operator=
                                      ((string *)&local_348,(string *)&local_4a0);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                              operator_delete(local_4a0._M_dataplus._M_p,
                                              local_4a0.field_2._M_allocated_capacity + 1);
                            }
                          }
                          bVar4 = Json::Value::isMember(pVVar12,"InnerIp");
                          if (bVar4) {
                            pVVar13 = Json::Value::operator[](pVVar12,"InnerIp");
                            Json::Value::asString_abi_cxx11_(&local_4a0,pVVar13);
                            std::__cxx11::string::operator=
                                      ((string *)&local_328,(string *)&local_4a0);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                              operator_delete(local_4a0._M_dataplus._M_p,
                                              local_4a0.field_2._M_allocated_capacity + 1);
                            }
                          }
                          bVar4 = Json::Value::isMember(pVVar12,"DiskInfo");
                          if (bVar4) {
                            pVVar12 = Json::Value::operator[](pVVar12,"DiskInfo");
                            Json::Value::asString_abi_cxx11_(&local_4a0,pVVar12);
                            std::__cxx11::string::operator=
                                      ((string *)&local_308,(string *)&local_4a0);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                              operator_delete(local_4a0._M_dataplus._M_p,
                                              local_4a0.field_2._M_allocated_capacity + 1);
                            }
                          }
                          std::
                          vector<aliyun::EmrDescribeExecutePlanNodeType,_std::allocator<aliyun::EmrDescribeExecutePlanNodeType>_>
                          ::push_back((vector<aliyun::EmrDescribeExecutePlanNodeType,_std::allocator<aliyun::EmrDescribeExecutePlanNodeType>_>
                                       *)local_478,(value_type *)local_368);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_p != &local_2f8) {
                            operator_delete(local_308._M_p,
                                            CONCAT71(local_2f8._M_allocated_capacity._1_7_,
                                                     local_2f8._M_local_buf[0]) + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_328._M_p != &local_318) {
                            operator_delete(local_328._M_p,
                                            CONCAT71(local_318._M_allocated_capacity._1_7_,
                                                     local_318._M_local_buf[0]) + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_348._M_p != &local_338) {
                            operator_delete(local_348._M_p,
                                            CONCAT71(local_338._M_allocated_capacity._1_7_,
                                                     local_338._M_local_buf[0]) + 1);
                          }
                          if ((pointer)local_368._0_8_ != pcVar2) {
                            operator_delete((void *)local_368._0_8_,
                                            CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
                          }
                          AVar7 = Json::Value::size(pVVar11);
                          uVar15 = uVar15 + 1;
                        } while (uVar15 < AVar7);
                      }
                    }
                  }
                  std::
                  vector<aliyun::EmrDescribeExecutePlanEcsRoleType,_std::allocator<aliyun::EmrDescribeExecutePlanEcsRoleType>_>
                  ::push_back(local_2a8,(value_type *)local_478);
                  EmrDescribeExecutePlanEcsRoleType::~EmrDescribeExecutePlanEcsRoleType
                            ((EmrDescribeExecutePlanEcsRoleType *)local_478);
                  AVar7 = Json::Value::size(local_480);
                  uVar15 = local_36c + 1;
                } while (uVar15 < AVar7);
              }
            }
          }
        }
      }
      goto LAB_0013520b;
    }
    if (error_info == (EmrErrorInfo *)0x0) goto LAB_00135206;
    pcVar8 = "parse response failed";
  }
  else {
    if (error_info == (EmrErrorInfo *)0x0) {
LAB_00135206:
      iVar5 = -1;
      goto LAB_0013520b;
    }
    pcVar8 = "connect to host failed";
  }
  iVar5 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar8);
LAB_0013520b:
  pAVar3 = local_4a8;
  AliRpcRequest::~AliRpcRequest(local_4a8);
  operator_delete(pAVar3,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_4c0);
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,local_2d8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                             local_2c8.field_2._M_local_buf[0]) + 1);
  }
  return iVar5;
}

Assistant:

int Emr::DescribeExecutePlan(const EmrDescribeExecutePlanRequestType& req,
                      EmrDescribeExecutePlanResponseType* response,
                       EmrErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeExecutePlan");
  if(!req.id.empty()) {
    req_rpc->AddRequestQuery("Id", req.id);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}